

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

void __thiscall google::protobuf::MessageLite::LogInitializationErrorMessage(MessageLite *this)

{
  LogMessage *other;
  string local_80;
  string local_60 [32];
  LogMessage local_40;
  
  internal::LogMessage::LogMessage
            (&local_40,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/message_lite.cc"
             ,0x7a);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)&local_80);
  std::__cxx11::string::append((char *)&local_80);
  std::__cxx11::string::append((char *)&local_80);
  (*this->_vptr_MessageLite[2])(local_60,this);
  std::__cxx11::string::append((string *)&local_80);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::append((char *)&local_80);
  (*this->_vptr_MessageLite[9])(local_60,this);
  std::__cxx11::string::append((string *)&local_80);
  std::__cxx11::string::~string(local_60);
  other = internal::LogMessage::operator<<(&local_40,&local_80);
  internal::LogFinisher::operator=((LogFinisher *)local_60,other);
  std::__cxx11::string::~string((string *)&local_80);
  internal::LogMessage::~LogMessage(&local_40);
  return;
}

Assistant:

void MessageLite::LogInitializationErrorMessage() const {
  GOOGLE_LOG(ERROR) << InitializationErrorMessage("parse", *this);
}